

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_view_suite.cpp
# Opt level: O0

void dynamic_api_suite::api_ctor_move(void)

{
  undefined4 local_84;
  size_type local_80;
  undefined4 local_74;
  size_type local_70 [2];
  undefined1 local_60 [8];
  map_view<int,_int,_18446744073709551615UL,_std::less<int>_> clone;
  size_type local_40;
  undefined4 local_34;
  size_type local_30 [2];
  undefined1 local_20 [8];
  map_view<int,_int,_18446744073709551615UL,_std::less<int>_> span;
  
  vista::map_view<int,_int,_18446744073709551615UL,_std::less<int>_>::map_view
            ((map_view<int,_int,_18446744073709551615UL,_std::less<int>_> *)local_20);
  local_30[0] = vista::map_view<int,_int,_18446744073709551615UL,_std::less<int>_>::capacity
                          ((map_view<int,_int,_18446744073709551615UL,_std::less<int>_> *)local_20);
  local_34 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.capacity()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x22,"void dynamic_api_suite::api_ctor_move()",local_30,&local_34);
  local_40 = vista::map_view<int,_int,_18446744073709551615UL,_std::less<int>_>::size
                       ((map_view<int,_int,_18446744073709551615UL,_std::less<int>_> *)local_20);
  clone.member.tail._4_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x23,"void dynamic_api_suite::api_ctor_move()",&local_40,
             (undefined1 *)((long)&clone.member.tail + 4));
  local_60 = local_20;
  clone.super_span<vista::pair<int,_int>,_18446744073709551615UL>.member.head =
       span.super_span<vista::pair<int,_int>,_18446744073709551615UL>.member.head;
  clone.super_span<vista::pair<int,_int>,_18446744073709551615UL>.member.tail =
       span.super_span<vista::pair<int,_int>,_18446744073709551615UL>.member.tail;
  local_70[0] = vista::map_view<int,_int,_18446744073709551615UL,_std::less<int>_>::capacity
                          ((map_view<int,_int,_18446744073709551615UL,_std::less<int>_> *)local_60);
  local_74 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("clone.capacity()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x25,"void dynamic_api_suite::api_ctor_move()",local_70,&local_74);
  local_80 = vista::map_view<int,_int,_18446744073709551615UL,_std::less<int>_>::size
                       ((map_view<int,_int,_18446744073709551615UL,_std::less<int>_> *)local_60);
  local_84 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("clone.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x26,"void dynamic_api_suite::api_ctor_move()",&local_80,&local_84);
  return;
}

Assistant:

void api_ctor_move()
{
    map_view<int, int> span;
    BOOST_TEST_EQ(span.capacity(), 0);
    BOOST_TEST_EQ(span.size(), 0);
    map_view<int, int> clone(std::move(span));
    BOOST_TEST_EQ(clone.capacity(), 0);
    BOOST_TEST_EQ(clone.size(), 0);
}